

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

char * __thiscall cmsys::RegExpCompile::regbranch(RegExpCompile *this,int *flagp)

{
  bool bVar1;
  uint local_3c;
  char *pcStack_38;
  int flags;
  char *latest;
  char *chain;
  char *ret;
  int *flagp_local;
  RegExpCompile *this_local;
  
  *flagp = 0;
  ret = (char *)flagp;
  flagp_local = (int *)this;
  chain = regnode(this,'\x06');
  latest = (char *)0x0;
  while( true ) {
    bVar1 = false;
    if ((*this->regparse != '\0') && (bVar1 = false, *this->regparse != '|')) {
      bVar1 = *this->regparse != ')';
    }
    if (!bVar1) break;
    pcStack_38 = regpiece(this,(int *)&local_3c);
    if (pcStack_38 == (char *)0x0) {
      return (char *)0x0;
    }
    *(uint *)ret = local_3c & 1 | *(uint *)ret;
    if (latest == (char *)0x0) {
      *(uint *)ret = local_3c & 4 | *(uint *)ret;
    }
    else {
      regtail(latest,pcStack_38);
    }
    latest = pcStack_38;
  }
  if (latest == (char *)0x0) {
    regnode(this,'\t');
  }
  return chain;
}

Assistant:

char* RegExpCompile::regbranch(int* flagp)
{
  char* ret;
  char* chain;
  char* latest;
  int flags;

  *flagp = WORST; // Tentatively.

  ret = regnode(BRANCH);
  chain = KWSYS_NULLPTR;
  while (*regparse != '\0' && *regparse != '|' && *regparse != ')') {
    latest = regpiece(&flags);
    if (latest == KWSYS_NULLPTR)
      return (KWSYS_NULLPTR);
    *flagp |= flags & HASWIDTH;
    if (chain == KWSYS_NULLPTR) // First piece.
      *flagp |= flags & SPSTART;
    else
      regtail(chain, latest);
    chain = latest;
  }
  if (chain == KWSYS_NULLPTR) // Loop ran zero times.
    regnode(NOTHING);

  return (ret);
}